

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::_q_contentsChanged
          (QWidgetTextControlPrivate *this,int from,int charsRemoved,int charsAdded)

{
  long lVar1;
  long lVar2;
  MoveMode MVar3;
  char cVar4;
  int iVar5;
  QAccessibleEvent *pQVar6;
  int iVar7;
  long in_FS_OFFSET;
  QTextCursor tmp;
  QString local_78;
  QArrayData *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  cVar4 = QAccessible::isActive();
  if (((cVar4 != '\0') && (lVar2 = *(long *)(*(long *)(lVar1 + 8) + 0x10), lVar2 != 0)) &&
     ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0)) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_40,this->doc);
    iVar7 = (int)(QTextCursor *)&local_40;
    QTextCursor::setPosition(iVar7,from);
    iVar5 = QTextDocument::characterCount();
    MVar3 = charsAdded + from;
    if ((int)(iVar5 - KeepAnchor) < charsAdded + from) {
      MVar3 = iVar5 - KeepAnchor;
    }
    QTextCursor::setPosition(iVar7,MVar3);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::selectedText();
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(&local_78,(long)charsRemoved,(QChar)0x20);
    if (charsRemoved == 0) {
      pQVar6 = (QAccessibleEvent *)operator_new(0x40);
      *(undefined8 *)(pQVar6 + 0x10) = *(undefined8 *)(*(long *)(lVar1 + 8) + 0x10);
      *(undefined4 *)(pQVar6 + 0x18) = 0xffffffff;
      *(int *)(pQVar6 + 0x1c) = (int)local_48 + from;
      *(undefined4 *)(pQVar6 + 8) = 0x11b;
      *(code **)pQVar6 = QPainterPath::contains;
      *(int *)(pQVar6 + 0x20) = from;
      *(QArrayData **)(pQVar6 + 0x28) = local_58;
      *(undefined1 **)(pQVar6 + 0x30) = puStack_50;
      *(undefined1 **)(pQVar6 + 0x38) = local_48;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(undefined4 *)(pQVar6 + 8) = 0x11e;
    }
    else if (charsAdded == 0) {
      pQVar6 = (QAccessibleEvent *)operator_new(0x40);
      *(undefined8 *)(pQVar6 + 0x10) = *(undefined8 *)(*(long *)(lVar1 + 8) + 0x10);
      *(undefined4 *)(pQVar6 + 0x18) = 0xffffffff;
      *(int *)(pQVar6 + 0x1c) = from;
      *(undefined4 *)(pQVar6 + 8) = 0x11b;
      *(code **)pQVar6 = QLocale::groupSeparator;
      *(int *)(pQVar6 + 0x20) = from;
      *(Data **)(pQVar6 + 0x28) = local_78.d.d;
      *(char16_t **)(pQVar6 + 0x30) = local_78.d.ptr;
      *(qsizetype *)(pQVar6 + 0x38) = local_78.d.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(undefined4 *)(pQVar6 + 8) = 0x11f;
    }
    else {
      pQVar6 = (QAccessibleEvent *)operator_new(0x58);
      *(undefined8 *)(pQVar6 + 0x10) = *(undefined8 *)(*(long *)(lVar1 + 8) + 0x10);
      *(undefined4 *)(pQVar6 + 0x18) = 0xffffffff;
      *(int *)(pQVar6 + 0x1c) = (int)local_48 + from;
      *(undefined4 *)(pQVar6 + 8) = 0x11b;
      *(code **)pQVar6 = QGridLayoutEngine::effectiveLastRow;
      *(int *)(pQVar6 + 0x20) = from;
      *(Data **)(pQVar6 + 0x28) = local_78.d.d;
      *(char16_t **)(pQVar6 + 0x30) = local_78.d.ptr;
      *(qsizetype *)(pQVar6 + 0x38) = local_78.d.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(QArrayData **)(pQVar6 + 0x40) = local_58;
      *(undefined1 **)(pQVar6 + 0x48) = puStack_50;
      *(undefined1 **)(pQVar6 + 0x50) = local_48;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(undefined4 *)(pQVar6 + 8) = 0x120;
    }
    QAccessible::updateAccessibility(pQVar6);
    (**(code **)(*(long *)pQVar6 + 8))(pQVar6);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    QTextCursor::~QTextCursor((QTextCursor *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::_q_contentsChanged(int from, int charsRemoved, int charsAdded)
{
#if QT_CONFIG(accessibility)
    Q_Q(QWidgetTextControl);

    if (QAccessible::isActive() && q->parent() && q->parent()->isWidgetType()) {
        QTextCursor tmp(doc);
        tmp.setPosition(from);
        // when setting a new text document the length is off
        // QTBUG-32583 - characterCount is off by 1 requires the -1
        tmp.setPosition(qMin(doc->characterCount() - 1, from + charsAdded), QTextCursor::KeepAnchor);
        QString newText = tmp.selectedText();

        // always report the right number of removed chars, but in lack of the real string use spaces
        QString oldText = QString(charsRemoved, u' ');

        QAccessibleEvent *ev = nullptr;
        if (charsRemoved == 0) {
            ev = new QAccessibleTextInsertEvent(q->parent(), from, newText);
        } else if (charsAdded == 0) {
            ev = new QAccessibleTextRemoveEvent(q->parent(), from, oldText);
        } else {
            ev = new QAccessibleTextUpdateEvent(q->parent(), from, oldText, newText);
        }
        QAccessible::updateAccessibility(ev);
        delete ev;
    }
#else
    Q_UNUSED(from);
    Q_UNUSED(charsRemoved);
    Q_UNUSED(charsAdded);
#endif
}